

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPReductionClause::generateDOT
          (OpenMPReductionClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  OpenMPReductionClauseIdentifier OVar1;
  pointer ppcVar2;
  allocator<char> local_1e1;
  string node_id;
  string local_1c0;
  int local_19c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  OpenMPReductionClause *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string parameter_string;
  string local_130;
  string indent;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string clause_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  local_178 = this;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  std::__cxx11::to_string(&local_130,depth);
  std::operator+(&node_id,"reduction_",&local_130);
  std::operator+(&parameter_string,&node_id,"_");
  std::__cxx11::to_string(&local_1c0,index);
  std::operator+(&clause_kind,&parameter_string,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_130);
  std::operator+(&local_1c0,&indent,parent_node);
  std::operator+(&local_130,&local_1c0,"-- ");
  std::operator+(&node_id,&local_130,&clause_kind);
  std::operator+(&parameter_string,&node_id,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&parameter_string);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  OVar1 = local_178->identifier;
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  if ((local_178->modifier < OMPC_REDUCTION_MODIFIER_unknown) &&
     (std::__cxx11::string::assign((char *)&parameter_string),
     parameter_string._M_string_length != 0)) {
    std::operator+(&node_id,&clause_kind,"_modifier");
    std::operator+(&local_198,&indent,&clause_kind);
    std::operator+(&local_170,&local_198," -- ");
    std::operator+(&local_1c0,&local_170,&node_id);
    std::operator+(&local_130,&local_1c0,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_d0,&indent,"\t");
    std::operator+(&local_b0,&local_d0,&node_id);
    std::operator+(&local_90,&local_b0," [label = \"");
    std::operator+(&local_198,&local_90,&node_id);
    std::operator+(&local_170,&local_198,"\\n ");
    std::operator+(&local_1c0,&local_170,&parameter_string);
    std::operator+(&local_130,&local_1c0,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&node_id);
  }
  parameter_string._M_string_length = 0;
  *parameter_string._M_dataplus._M_p = '\0';
  switch(OVar1) {
  case OMPC_REDUCTION_IDENTIFIER_plus:
    break;
  case OMPC_REDUCTION_IDENTIFIER_minus:
    break;
  case OMPC_REDUCTION_IDENTIFIER_mul:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitand:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitor:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitxor:
    break;
  case OMPC_REDUCTION_IDENTIFIER_logand:
    break;
  case OMPC_REDUCTION_IDENTIFIER_logor:
    break;
  default:
    goto switchD_00152f46_caseD_8;
  case OMPC_REDUCTION_IDENTIFIER_max:
    break;
  case OMPC_REDUCTION_IDENTIFIER_min:
    break;
  case OMPC_REDUCTION_IDENTIFIER_user:
    std::__cxx11::string::string((string *)&node_id,(string *)&local_178->user_defined_identifier);
    std::__cxx11::string::operator=((string *)&parameter_string,(string *)&node_id);
    std::__cxx11::string::~string((string *)&node_id);
    goto switchD_00152f46_caseD_8;
  }
  std::__cxx11::string::assign((char *)&parameter_string);
switchD_00152f46_caseD_8:
  if (parameter_string._M_string_length != 0) {
    std::operator+(&node_id,&clause_kind,"_identifier");
    std::operator+(&local_198,&indent,&clause_kind);
    std::operator+(&local_170,&local_198," -- ");
    std::operator+(&local_1c0,&local_170,&node_id);
    std::operator+(&local_130,&local_1c0,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_d0,&indent,"\t");
    std::operator+(&local_b0,&local_d0,&node_id);
    std::operator+(&local_90,&local_b0," [label = \"");
    std::operator+(&local_198,&local_90,&node_id);
    std::operator+(&local_170,&local_198,"\\n ");
    std::operator+(&local_1c0,&local_170,&parameter_string);
    std::operator+(&local_130,&local_1c0,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&node_id);
  }
  node_id._M_dataplus._M_p = (pointer)&node_id.field_2;
  node_id._M_string_length = 0;
  node_id.field_2._M_local_buf[0] = '\0';
  ppcVar2 = (local_178->super_OpenMPClause).expressions.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_19c = 0;
  for (; ppcVar2 !=
         (local_178->super_OpenMPClause).expressions.
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    std::operator+(&local_1c0,&clause_kind,"_expr");
    std::__cxx11::to_string(&local_170,local_19c);
    std::operator+(&local_130,&local_1c0,&local_170);
    std::__cxx11::string::operator=((string *)&node_id,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::operator+(&local_198,&indent,&clause_kind);
    std::operator+(&local_170,&local_198," -- ");
    std::operator+(&local_1c0,&local_170,&node_id);
    std::operator+(&local_130,&local_1c0,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_d0,&indent,"\t");
    std::operator+(&local_b0,&local_d0,&node_id);
    std::operator+(&local_90,&local_b0," [label = \"");
    std::operator+(&local_198,&local_90,&node_id);
    std::operator+(&local_170,&local_198,"\\n ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar2,&local_1e1);
    std::operator+(&local_1c0,&local_170,&local_50);
    std::operator+(&local_130,&local_1c0,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    local_19c = local_19c + 1;
  }
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&clause_kind);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  return;
}

Assistant:

void OpenMPReductionClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "reduction_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPReductionClauseModifier modifier = this->getModifier();
    OpenMPReductionClauseIdentifier identifier = this->getIdentifier();
    std::string parameter_string;
    switch (modifier) {
        case OMPC_REDUCTION_MODIFIER_default:
            parameter_string = "default";
            break;
        case OMPC_REDUCTION_MODIFIER_inscan:
            parameter_string = "inscan";
            break;
        case OMPC_REDUCTION_MODIFIER_task:
            parameter_string = "task";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_modifier";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    parameter_string.clear();
    switch (identifier) {
        case OMPC_REDUCTION_IDENTIFIER_plus:
            parameter_string = "+";
            break;
        case OMPC_REDUCTION_IDENTIFIER_minus:
            parameter_string  = "-";
            break;
        case OMPC_REDUCTION_IDENTIFIER_mul:
            parameter_string = "*";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitand:
            parameter_string = "&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitor:
            parameter_string = "|";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitxor:
            parameter_string = "^";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logand:
            parameter_string = "&&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logor:
            parameter_string = "||";
            break;
        case OMPC_REDUCTION_IDENTIFIER_min:
            parameter_string = "min";
            break;
        case OMPC_REDUCTION_IDENTIFIER_max:
            parameter_string = "max";
            break;
        case OMPC_REDUCTION_IDENTIFIER_user:
            parameter_string = this->getUserDefinedIdentifier();
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_identifier";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}